

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O0

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator**,std::vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>>>
               (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                begin,__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                      end)

{
  EnumGenerator *this;
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  local_20;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  temp;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  end_local;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  begin_local;
  
  temp._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  while (bVar1 = __gnu_cxx::operator!=(&end_local,&temp), bVar1) {
    local_20._M_current = end_local._M_current;
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
    ::operator++(&end_local);
    ppEVar2 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
              ::operator*(&local_20);
    this = *ppEVar2;
    if (this != (EnumGenerator *)0x0) {
      compiler::objectivec::EnumGenerator::~EnumGenerator(this);
      operator_delete(this,0x58);
    }
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}